

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
BinaryExpression<const_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_&,_(Catch::Internal::Operator)1,_const_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_&>
::endExpression(BinaryExpression<const_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_&,_(Catch::Internal::Operator)1,_const_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_&>
                *this)

{
  bool result;
  ResultBuilder *pRVar1;
  BinaryExpression<const_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_&,_(Catch::Internal::Operator)1,_const_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_&>
  *this_local;
  
  pRVar1 = this->m_rb;
  result = Internal::
           compare<(Catch::Internal::Operator)1,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,float>>,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,float>>>
                     (this->m_lhs,this->m_rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  ResultBuilder::endExpression(pRVar1,&this->super_DecomposedExpression);
  return;
}

Assistant:

void endExpression() const {
        m_rb
            .setResultType( Internal::compare<Op>( m_lhs, m_rhs ) )
            .endExpression( *this );
    }